

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptWeakSet.cpp
# Opt level: O1

void __thiscall
Js::JavascriptWeakSet::ExtractSnapObjectDataInto
          (JavascriptWeakSet *this,SnapObject *objData,SlabAllocator *alloc)

{
  uint uVar1;
  int iVar2;
  Type pRVar3;
  code *pcVar4;
  bool bVar5;
  uint uVar6;
  uint *puVar7;
  void **ppvVar8;
  undefined4 *puVar9;
  ulong uVar10;
  ulong count;
  int i;
  int last;
  
  puVar7 = (uint *)TTD::SlabAllocatorBase<0>::SlabAllocateTypeRawSize<16ul>(alloc);
  (**(this->keySet).
     super_SplitWeakDictionary<bool,_Js::RecyclableObject_*,_true,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_RecyclerPointerComparer,_JsUtil::NoResizeLock,_Memory::Recycler>
     .super_IWeakReferenceDictionary._vptr_IWeakReferenceDictionary)();
  uVar6 = (this->keySet).
          super_SplitWeakDictionary<bool,_Js::RecyclableObject_*,_true,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_RecyclerPointerComparer,_JsUtil::NoResizeLock,_Memory::Recycler>
          .count - (this->keySet).
                   super_SplitWeakDictionary<bool,_Js::RecyclableObject_*,_true,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_RecyclerPointerComparer,_JsUtil::NoResizeLock,_Memory::Recycler>
                   .freeCount;
  *puVar7 = 0;
  count = (ulong)(uVar6 + 1);
  ppvVar8 = TTD::SlabAllocatorBase<0>::SlabReserveArraySpace<void*>(alloc,count);
  *(void ***)(puVar7 + 2) = ppvVar8;
  if ((this->keySet).
      super_SplitWeakDictionary<bool,_Js::RecyclableObject_*,_true,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_RecyclerPointerComparer,_JsUtil::NoResizeLock,_Memory::Recycler>
      .bucketCount != 0) {
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    uVar10 = 0;
    do {
      i = (this->keySet).
          super_SplitWeakDictionary<bool,_Js::RecyclableObject_*,_true,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_RecyclerPointerComparer,_JsUtil::NoResizeLock,_Memory::Recycler>
          .buckets.ptr[uVar10];
      if (i != -1) {
        last = -1;
        do {
          pRVar3 = (this->keySet).
                   super_SplitWeakDictionary<bool,_Js::RecyclableObject_*,_true,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_RecyclerPointerComparer,_JsUtil::NoResizeLock,_Memory::Recycler>
                   .weakRefs.ptr[i].ptr;
          if (pRVar3 == (Type)0x0) {
            iVar2 = (this->keySet).
                    super_SplitWeakDictionary<bool,_Js::RecyclableObject_*,_true,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_RecyclerPointerComparer,_JsUtil::NoResizeLock,_Memory::Recycler>
                    .entries.ptr[i].super_ValueEntryData<bool>.next;
            JsUtil::
            SplitWeakDictionary<bool,_Js::RecyclableObject_*,_true,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_RecyclerPointerComparer,_JsUtil::NoResizeLock,_Memory::Recycler>
            ::RemoveAt(&(this->keySet).
                        super_SplitWeakDictionary<bool,_Js::RecyclableObject_*,_true,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_RecyclerPointerComparer,_JsUtil::NoResizeLock,_Memory::Recycler>
                       ,i,last,(uint)uVar10);
          }
          else {
            if (uVar6 <= *puVar7) {
              AssertCount = AssertCount + 1;
              Throw::LogAssert();
              *puVar9 = 1;
              bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptWeakSet.cpp"
                                          ,0xf8,"(ssi->SetSize < setCountEst)","We are writing junk"
                                         );
              if (!bVar5) {
                pcVar4 = (code *)invalidInstructionException();
                (*pcVar4)();
              }
              *puVar9 = 0;
            }
            uVar1 = *puVar7;
            *(Type *)(*(long *)(puVar7 + 2) + (ulong)uVar1 * 8) = pRVar3;
            *puVar7 = uVar1 + 1;
            iVar2 = (this->keySet).
                    super_SplitWeakDictionary<bool,_Js::RecyclableObject_*,_true,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_RecyclerPointerComparer,_JsUtil::NoResizeLock,_Memory::Recycler>
                    .entries.ptr[i].super_ValueEntryData<bool>.next;
            last = i;
          }
          i = iVar2;
        } while (i != -1);
      }
      uVar10 = uVar10 + 1;
    } while (uVar10 < (this->keySet).
                      super_SplitWeakDictionary<bool,_Js::RecyclableObject_*,_true,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_RecyclerPointerComparer,_JsUtil::NoResizeLock,_Memory::Recycler>
                      .bucketCount);
  }
  if ((ulong)*puVar7 == 0) {
    puVar7[2] = 0;
    puVar7[3] = 0;
    TTD::SlabAllocatorBase<0>::SlabAbortArraySpace<void*>(alloc,count);
  }
  else {
    TTD::SlabAllocatorBase<0>::SlabCommitArraySpace<void*>(alloc,(ulong)*puVar7,count);
  }
  if (objData->SnapObjectTag == SnapSetObject) {
    objData->AddtlSnapObjectInfo = puVar7;
    return;
  }
  TTDAbort_unrecoverable_error("Tag does not match.");
}

Assistant:

void JavascriptWeakSet::ExtractSnapObjectDataInto(TTD::NSSnapObjects::SnapObject* objData, TTD::SlabAllocator& alloc)
    {
        TTD::NSSnapObjects::SnapSetInfo* ssi = alloc.SlabAllocateStruct<TTD::NSSnapObjects::SnapSetInfo>();
        uint32 setCountEst = this->Size();

        ssi->SetSize = 0;
        ssi->SetValueArray = alloc.SlabReserveArraySpace<TTD::TTDVar>(setCountEst + 1); //always reserve at least 1 element

        this->Map([&](RecyclableObject* key)
        {
            AssertMsg(ssi->SetSize < setCountEst, "We are writing junk");

            ssi->SetValueArray[ssi->SetSize] = key;
            ssi->SetSize++;
        });

        if(ssi->SetSize == 0)
        {
            ssi->SetValueArray = nullptr;
            alloc.SlabAbortArraySpace<TTD::TTDVar>(setCountEst + 1);
        }
        else
        {
            alloc.SlabCommitArraySpace<TTD::TTDVar>(ssi->SetSize, setCountEst + 1);
        }

        TTD::NSSnapObjects::StdExtractSetKindSpecificInfo<TTD::NSSnapObjects::SnapSetInfo*, TTD::NSSnapObjects::SnapObjectType::SnapSetObject>(objData, ssi);
    }